

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Value::append(Value *this,Value *value)

{
  map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
  *this_00;
  ValueType VVar1;
  pointer ppVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>,_bool> pVar3;
  ArrayIndex local_1fc;
  _Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_1f8;
  undefined1 local_1f0;
  Value local_1e8;
  String local_1c0;
  ostringstream local_190 [8];
  OStringStream oss;
  Value *value_local;
  Value *this_local;
  
  VVar1 = type(this);
  if (VVar1 != nullValue) {
    VVar1 = type(this);
    if (VVar1 != arrayValue) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::operator<<((ostream *)local_190,"in Json::Value::append: requires arrayValue");
      std::__cxx11::ostringstream::str();
      throwLogicError(&local_1c0);
    }
  }
  VVar1 = type(this);
  if (VVar1 == nullValue) {
    Value(&local_1e8,arrayValue);
    operator=(this,&local_1e8);
    ~Value(&local_1e8);
  }
  this_00 = (map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
             *)(this->value_).map_;
  local_1fc = size(this);
  pVar3 = std::
          map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
          ::emplace<unsigned_int,Json::Value>(this_00,&local_1fc,value);
  local_1f8 = pVar3.first._M_node;
  local_1f0 = pVar3.second;
  ppVar2 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator->
                     (&local_1f8);
  return &ppVar2->second;
}

Assistant:

Value& Value::append(Value&& value) {
  JSON_ASSERT_MESSAGE(type() == nullValue || type() == arrayValue,
                      "in Json::Value::append: requires arrayValue");
  if (type() == nullValue) {
    *this = Value(arrayValue);
  }
  return this->value_.map_->emplace(size(), std::move(value)).first->second;
}